

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O1

void arssort(string *strings,size_t scnt)

{
  byte bVar1;
  void *pvVar2;
  list plVar3;
  int iVar4;
  uint uVar5;
  list __ptr;
  stack *psVar6;
  size_t sVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  list plVar11;
  long lVar12;
  list plVar13;
  list plVar14;
  bucket_conflict1 *b;
  uint uVar15;
  ulong uVar16;
  list plVar17;
  ulong uVar18;
  int used1 [256];
  uint local_838 [256];
  uint local_438 [258];
  
  __ptr = (list)calloc(scnt,0x18);
  if (scnt != 0) {
    uVar10 = 0;
    plVar17 = __ptr;
    do {
      plVar17->str = strings[uVar10];
      plVar11 = (list)0x0;
      if (uVar10 < scnt - 1) {
        plVar11 = plVar17 + 1;
      }
      plVar17->next = plVar11;
      uVar10 = uVar10 + 1;
      plVar17 = plVar17 + 1;
    } while (scnt != uVar10);
  }
  plVar17 = __ptr;
  if (1 < (int)scnt) {
    iVar8 = 1000;
    if (1000 < (uint)((scnt & 0xffffffff) / 0x32)) {
      iVar8 = (int)((scnt & 0xffffffff) / 0x32);
    }
    stackmem[0].blocksize = iVar8 * 0x18;
    stackmem[0].block[0] = malloc((ulong)(uint)stackmem[0].blocksize);
    stackmem[0].allocnr = 0;
    stackmem[0].nr = -1;
    stackmem[0].current = (void *)0x0;
    stackmem[0].first = (void *)0x0;
    plVar17 = (list)0x0;
    stackmem[0].last = (void *)0x0;
    psVar6 = (stack *)allocmem(stackmem,0x18);
    psVar6->head = __ptr;
    psVar6->tail = (list)0x0;
    psVar6->size = (int)scnt;
    psVar6->pos = 0;
    do {
      while( true ) {
        if (stackmem[0].first < stackmem[0].current) {
          stackmem[0].current = (void *)((long)stackmem[0].current + -0x18);
        }
        else {
          iVar8 = stackmem[0].nr;
          uVar5 = stackmem[0].nr - 1;
          stackmem[0].nr = uVar5;
          if (iVar8 < 1) {
            stackmem[0].current = (void *)0x0;
            stackmem[0].first = (void *)0x0;
            stackmem[0].last = (void *)0x0;
          }
          else {
            stackmem[0].first = stackmem[0].block[uVar5];
            stackmem[0].current =
                 (void *)((long)stackmem[0].first + (long)stackmem[0].blocksize + -0x18);
            stackmem[0].last = stackmem[0].current;
          }
        }
        pvVar2 = stackmem[0].current;
        stackp = (stack *)stackmem[0].current;
        if (psVar6->size == 0) break;
        plVar11 = psVar6->head;
        iVar8 = psVar6->pos;
        if (psVar6->size < 0x5dd) {
          uVar5 = (uint)plVar11->str[iVar8];
          if (plVar11->next == (list)0x0) {
            iVar4 = 1;
            uVar16 = 0;
            uVar10 = 0xff;
            plVar14 = plVar11;
          }
          else {
            uVar10 = 0xff;
            uVar16 = 0;
            iVar4 = 1;
            plVar13 = plVar11;
            plVar3 = plVar11->next;
            do {
              plVar14 = plVar3;
              bVar1 = plVar14->str[iVar8];
              if (uVar5 == bVar1) {
                iVar4 = iVar4 + 1;
              }
              else {
                lVar9 = (ulong)uVar5 * 0x18;
                if ((&onebyte_b)[(ulong)uVar5 * 3] == 0) {
                  (&onebyte_b)[(ulong)uVar5 * 3] = (long)plVar11;
                  *(list *)(&DAT_00c9e788 + lVar9) = plVar13;
                  *(int *)(&DAT_00c9e790 + lVar9) = iVar4;
                  if (uVar5 != 0) {
                    if (uVar5 <= (uint)uVar10) {
                      uVar10 = (ulong)uVar5;
                    }
                    if ((uint)uVar16 <= uVar5) {
                      uVar16 = (ulong)uVar5;
                    }
                  }
                }
                else {
                  *(list *)(*(long *)(&DAT_00c9e788 + lVar9) + 8) = plVar11;
                  *(list *)(&DAT_00c9e788 + lVar9) = plVar13;
                  *(int *)(&DAT_00c9e790 + lVar9) = *(int *)(&DAT_00c9e790 + lVar9) + iVar4;
                }
                iVar4 = 1;
                plVar11 = plVar14;
                uVar5 = (uint)bVar1;
              }
              plVar13 = plVar14;
              plVar3 = plVar14->next;
            } while (plVar14->next != (list)0x0);
          }
          lVar9 = (ulong)uVar5 * 0x18;
          if ((&onebyte_b)[(ulong)uVar5 * 3] == 0) {
            (&onebyte_b)[(ulong)uVar5 * 3] = (long)plVar11;
            *(list *)(&DAT_00c9e788 + lVar9) = plVar14;
            *(int *)(&DAT_00c9e790 + lVar9) = iVar4;
            if (uVar5 != 0) {
              if (uVar5 <= (uint)uVar10) {
                uVar10 = (ulong)uVar5;
              }
              if ((uint)uVar16 <= uVar5) {
                uVar16 = (ulong)uVar5;
              }
            }
          }
          else {
            *(list *)(*(long *)(&DAT_00c9e788 + lVar9) + 8) = plVar11;
            *(list *)(&DAT_00c9e788 + lVar9) = plVar14;
            *(int *)(&DAT_00c9e790 + lVar9) = *(int *)(&DAT_00c9e790 + lVar9) + iVar4;
          }
          if (onebyte_b != 0) {
            _DAT_00c9e790 = 0;
            ontostack((bucket_conflict1 *)&onebyte_b,iVar8);
          }
          if ((uint)uVar10 <= (uint)uVar16) {
            b = (bucket_conflict1 *)(&onebyte_b + uVar10 * 3);
            do {
              if (b->head != (list)0x0) {
                ontostack(b,iVar8 + 1);
              }
              b = b + 1;
            } while (b <= (bucket_conflict1 *)(&onebyte_b + uVar16 * 3));
          }
        }
        else {
          uVar5 = 0;
          memset(local_838,0,0x400);
          memset(local_438,0,0x400);
          bVar1 = plVar11->str[iVar8];
          if (bVar1 != 0) {
            uVar5 = (uint)plVar11->str[(long)iVar8 + 1];
          }
          iVar4 = 1;
          plVar14 = plVar11;
          uVar5 = (uint)bVar1 << 8 | uVar5;
          for (plVar13 = plVar11->next; plVar13 != (list)0x0; plVar13 = plVar13->next) {
            bVar1 = plVar13->str[iVar8];
            if (bVar1 == 0) {
              uVar15 = 0;
            }
            else {
              uVar15 = (uint)plVar13->str[(long)iVar8 + 1];
            }
            uVar15 = (uint)bVar1 << 8 | uVar15;
            if (uVar15 == uVar5) {
              iVar4 = iVar4 + 1;
              uVar15 = uVar5;
            }
            else {
              lVar9 = (ulong)uVar5 * 0x18;
              if (*(long *)(twobytes_b + lVar9) == 0) {
                *(list *)(twobytes_b + lVar9) = plVar11;
                *(list *)(twobytes_b + lVar9 + 8) = plVar14;
                *(int *)(twobytes_b + lVar9 + 0x10) = iVar4;
                local_838[uVar5 & 0xff] = 1;
                local_438[uVar5 >> 8] = 1;
              }
              else {
                *(list *)(*(long *)(twobytes_b + lVar9 + 8) + 8) = plVar11;
                *(list *)(twobytes_b + lVar9 + 8) = plVar14;
                *(int *)(twobytes_b + lVar9 + 0x10) = *(int *)(twobytes_b + lVar9 + 0x10) + iVar4;
              }
              iVar4 = 1;
              plVar11 = plVar13;
            }
            plVar14 = plVar13;
            uVar5 = uVar15;
          }
          lVar9 = (ulong)uVar5 * 0x18;
          if (*(long *)(twobytes_b + lVar9) == 0) {
            *(list *)(twobytes_b + lVar9) = plVar11;
            *(list *)(twobytes_b + lVar9 + 8) = plVar14;
            *(int *)(twobytes_b + lVar9 + 0x10) = iVar4;
            local_838[uVar5 & 0xff] = 1;
            local_438[uVar5 >> 8] = 1;
          }
          else {
            *(list *)(*(long *)(twobytes_b + lVar9 + 8) + 8) = plVar11;
            *(list *)(twobytes_b + lVar9 + 8) = plVar14;
            *(int *)(twobytes_b + lVar9 + 0x10) = *(int *)(twobytes_b + lVar9 + 0x10) + iVar4;
          }
          lVar9 = 0;
          uVar10 = 0;
          uVar5 = 0;
          do {
            if (local_438[lVar9] != 0) {
              lVar12 = (long)(int)uVar5;
              uVar5 = uVar5 + 1;
              local_438[lVar12] = (uint)lVar9;
            }
            if (local_838[lVar9] != 0) {
              iVar4 = (int)uVar10;
              uVar10 = (ulong)(iVar4 + 1);
              local_838[iVar4] = (uint)lVar9;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x100);
          if (0 < (int)uVar5) {
            uVar16 = 0;
            do {
              if (0 < (int)uVar10) {
                uVar15 = local_438[uVar16];
                uVar18 = 0;
                do {
                  lVar9 = (long)(int)(local_838[uVar18] | uVar15 << 8);
                  if (*(long *)(twobytes_b + lVar9 * 0x18) != 0) {
                    lVar9 = lVar9 * 0x18;
                    if ((char)local_838[uVar18] == '\0') {
                      *(undefined4 *)(twobytes_b + lVar9 + 0x10) = 0;
                    }
                    ontostack((bucket_conflict1 *)(twobytes_b + lVar9),iVar8 + 2);
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar5);
          }
        }
        psVar6 = stackp;
        if (stackp == (stack *)0x0) goto LAB_0025272d;
      }
      psVar6->tail->next = plVar17;
      plVar17 = psVar6->head;
      psVar6 = (stack *)pvVar2;
    } while (pvVar2 != (void *)0x0);
LAB_0025272d:
    freemem(stackmem);
  }
  if (scnt != 0) {
    sVar7 = 0;
    do {
      strings[sVar7] = plVar17->str;
      sVar7 = sVar7 + 1;
      plVar17 = plVar17->next;
    } while (scnt != sVar7);
  }
  free(__ptr);
  return;
}

Assistant:

void arssort(string strings[], size_t scnt)
{
   list ptr, listnodes;
   int i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1]; 
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = MSD(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}